

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.cpp
# Opt level: O1

HandlePtr __thiscall
dg::vr::ValueRelations::getCorresponding
          (ValueRelations *this,ValueRelations *other,Handle otherH,
          VectorSet<const_llvm::Value_*> *otherEqual)

{
  pointer ppVVar1;
  V pVVar2;
  pointer prVar3;
  pointer ppVar4;
  bool bVar5;
  bool bVar6;
  pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_> *pair_2;
  HandlePtr pBVar7;
  Relations RVar8;
  ulong uVar9;
  Bucket *pBVar10;
  const_iterator cVar11;
  Handle pBVar12;
  pointer ppVar13;
  unsigned_long uVar14;
  pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_> *pair;
  pointer ppVar15;
  HandlePtr mLt;
  pointer ppVVar16;
  bool bVar17;
  pair<std::reference_wrapper<const_dg::vr::Bucket>,_bool> pVar18;
  HandlePtr mRt;
  Bucket *local_58;
  key_type local_38;
  
  ppVVar16 = (otherEqual->vec).
             super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppVVar1 = (otherEqual->vec).
            super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppVVar16 == ppVVar1) {
    prVar3 = (otherH->relatedBuckets)._M_elems[0xb].vec.
             super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (prVar3 == (otherH->relatedBuckets)._M_elems[0xb].vec.
                  super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      ppVar13 = (other->graph).borderBuckets.
                super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar4 = (other->graph).borderBuckets.
               super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar14 = 0xffffffffffffffff;
      if (ppVar13 != ppVar4) {
        ppVar15 = ppVar13;
        do {
          if (((ppVar15->second)._M_data)->id == otherH->id) {
            uVar14 = ppVar15->first;
            break;
          }
          ppVar15 = ppVar15 + 1;
        } while (ppVar15 != ppVar4);
      }
      for (ppVar15 = (this->graph).borderBuckets.
                     super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          ppVar15 !=
          (this->graph).borderBuckets.
          super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; ppVar15 = ppVar15 + 1) {
        if (ppVar15->first == uVar14) {
          pBVar7 = (ppVar15->second)._M_data;
          goto LAB_0012c9f9;
        }
      }
      pBVar7 = (HandlePtr)0x0;
LAB_0012c9f9:
      if (pBVar7 != (HandlePtr)0x0) {
        return pBVar7;
      }
      uVar14 = 0xffffffffffffffff;
      if (ppVar13 != ppVar4) {
        do {
          if (((ppVar13->second)._M_data)->id == otherH->id) {
            uVar14 = ppVar13->first;
            break;
          }
          ppVar13 = ppVar13 + 1;
        } while (ppVar13 != ppVar4);
      }
      pBVar10 = RelationsGraph<dg::vr::ValueRelations>::getBorderBucket(&this->graph,uVar14);
      local_38._M_data = pBVar10;
      std::
      map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
      ::operator[](&this->bucketToVals,&local_38);
      return pBVar10;
    }
    pBVar12 = prVar3->_M_data;
    local_38._M_data = pBVar12;
    cVar11 = std::
             _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::VectorSet<const_llvm::Value_*>_>_>_>
             ::find(&(other->bucketToVals)._M_t,&local_38);
    pBVar7 = getCorresponding(this,other,pBVar12,
                              (VectorSet<const_llvm::Value_*> *)&cVar11._M_node[1]._M_parent);
    if (pBVar7 != (HandlePtr)0x0) {
      pBVar12 = newPlaceholderBucket<dg::vr::Bucket>(this,pBVar7);
      bVar17 = RelationsGraph<dg::vr::ValueRelations>::addRelation
                         (&this->graph,pBVar7,PT,pBVar12,(Relations *)0x0);
      this->changed = (bool)(this->changed | bVar17);
      return pBVar12;
    }
  }
  else {
    bVar17 = false;
    local_58 = (Bucket *)0x0;
    do {
      pVVar2 = *ppVVar16;
      pBVar7 = maybeGet(this,pVVar2);
      bVar5 = true;
      pBVar10 = pBVar7;
      if ((local_58 != (Bucket *)0x0) &&
         (pBVar10 = local_58, pBVar7 != local_58 && pBVar7 != (HandlePtr)0x0)) {
        RVar8 = RelationsGraph<dg::vr::ValueRelations>::relationsBetween
                          (&this->graph,pBVar7,local_58);
        uVar9 = dg::vr::Relations::conflicting(EQ);
        if ((uVar9 & (ulong)RVar8.bits.super__Base_bitset<1UL>._M_w) == 0) {
          bVar6 = RelationsGraph<dg::vr::ValueRelations>::addRelation
                            (&this->graph,pBVar7,EQ,local_58,(Relations *)0x0);
          this->changed = (bool)(this->changed | bVar6);
          pBVar10 = maybeGet(this,pVVar2);
        }
        else {
          bVar5 = false;
        }
      }
      local_58 = pBVar10;
      if (!bVar5) break;
      ppVVar16 = ppVVar16 + 1;
      bVar17 = ppVVar16 == ppVVar1;
    } while (!bVar17);
    if (bVar17) {
      if (local_58 != (HandlePtr)0x0) {
        return local_58;
      }
      pVVar2 = *(otherEqual->vec).
                super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pBVar10 = RelationsGraph<dg::vr::ValueRelations>::getNewBucket(&this->graph);
      pVar18 = add(this,pVVar2,pBVar10);
      return pVar18.first._M_data;
    }
  }
  return (HandlePtr)0x0;
}

Assistant:

ValueRelations::HandlePtr
ValueRelations::getCorresponding(const ValueRelations &other, Handle otherH,
                                 const VectorSet<V> &otherEqual) {
    if (otherEqual.empty()) { // other is a placeholder bucket, therefore it is
                              // pointed to from other bucket
        if (!otherH.hasRelation(Relations::PF)) {
            HandlePtr thisH = getBorderH(other.getBorderId(otherH));
            return thisH ? thisH : &newBorderBucket(other.getBorderId(otherH));
        }
        assert(otherH.hasRelation(Relations::PF));
        Handle otherFromH = otherH.getRelated(Relations::PF);
        HandlePtr thisFromH = getCorresponding(other, otherFromH);
        if (!thisFromH)
            return nullptr;

        Handle h = newPlaceholderBucket(*thisFromH);
        bool ch = graph.addRelation(*thisFromH, Relations::PT, h);
        updateChanged(ch);
        return &h;
    }

    // otherwise find unique handle for all equal elements from other
    HandlePtr mH = nullptr;
    for (V val : otherEqual) {
        HandlePtr oH = maybeGet(val);
        if (!mH) // first handle found
            mH = oH;
        else if (oH && oH != mH) { // found non-equal handle in this
            if (hasConflictingRelation(*oH, *mH, Relations::EQ))
                return nullptr;
            set(*oH, Relations::EQ, *mH);
            mH = maybeGet(val); // update possibly invalidated handle
            assert(mH);
        }
    }
    return mH ? mH : &add(otherEqual.any(), graph.getNewBucket()).first.get();
}